

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O2

int __thiscall QTextTableCell::tableCellFormatIndex(QTextTableCell *this)

{
  QTextDocumentPrivate *pQVar1;
  
  pQVar1 = QTextDocumentPrivate::get((QTextObject *)this->table);
  return (pQVar1->fragments).data.field_0.fragments[(uint)this->fragment].format;
}

Assistant:

int QTextTableCell::tableCellFormatIndex() const
{
    const QTextDocumentPrivate *p = QTextDocumentPrivate::get(table);
    return QTextDocumentPrivate::FragmentIterator(&p->fragmentMap(), fragment)->format;
}